

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_legacy.cpp
# Opt level: O0

void setup_VPU_FRAME_from_mpp_frame(VpuCodecContext *ctx,VPU_FRAME *vframe,MppFrame mframe)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  RK_U32 RVar6;
  RK_U32 *pRVar7;
  undefined8 uVar8;
  RK_U32 *local_80;
  RK_S32 fd;
  void *ptr;
  MppBufferImpl *p;
  RK_U32 field_order;
  MppFrameColorSpace colorSpa;
  MppFrameColorPrimaries colorPri;
  MppFrameColorTransferCharacteristic colorTrc;
  MppFrameColorRange colorRan;
  RK_U32 mode;
  RK_U64 pts;
  MppBuffer buf;
  MppFrame mframe_local;
  VPU_FRAME *vframe_local;
  VpuCodecContext *ctx_local;
  
  pRVar7 = (RK_U32 *)mpp_frame_get_buffer(mframe);
  uVar8 = mpp_frame_get_pts(mframe);
  uVar1 = mpp_frame_get_mode(mframe);
  iVar2 = mpp_frame_get_color_range(mframe);
  uVar3 = mpp_frame_get_color_trc(mframe);
  uVar4 = mpp_frame_get_color_primaries(mframe);
  uVar5 = mpp_frame_get_colorspace(mframe);
  if (pRVar7 != (RK_U32 *)0x0) {
    mpp_buffer_inc_ref_with_caller(pRVar7,"setup_VPU_FRAME_from_mpp_frame");
  }
  vframe->CodingType = ctx->videoCoding;
  RVar6 = mpp_frame_get_width(mframe);
  vframe->DisplayWidth = RVar6;
  RVar6 = mpp_frame_get_height(mframe);
  vframe->DisplayHeight = RVar6;
  RVar6 = mpp_frame_get_hor_stride(mframe);
  vframe->FrameWidth = RVar6;
  RVar6 = mpp_frame_get_ver_stride(mframe);
  vframe->FrameHeight = RVar6;
  (vframe->field_16).Res[2] = (vframe->field_16).Res[2] & 0xfeffffff | (uint)(iVar2 == 2) << 0x18;
  (vframe->field_16).Res[2] = (vframe->field_16).Res[2] & 0xffffff00 | uVar4 & 0xff;
  (vframe->field_16).Res[2] = (vframe->field_16).Res[2] & 0xffff00ff | (uVar3 & 0xff) << 8;
  (vframe->field_16).Res[2] = (vframe->field_16).Res[2] & 0xff00ffff | (uVar5 & 0xff) << 0x10;
  if (uVar1 == 0) {
    vframe->FrameType = 0;
  }
  else {
    uVar1 = uVar1 & 0xc;
    if (uVar1 == 4) {
      vframe->FrameType = 1;
    }
    else if (uVar1 == 8) {
      vframe->FrameType = 2;
    }
    else if (uVar1 == 0xc) {
      vframe->FrameType = 4;
    }
  }
  uVar4 = mpp_frame_get_errinfo(mframe);
  uVar5 = mpp_frame_get_discard(mframe);
  vframe->ErrorInfo = uVar4 | uVar5;
  mode = (RK_U32)((ulong)uVar8 >> 0x20);
  (vframe->ShowTime).TimeHigh = mode;
  colorRan = (MppFrameColorRange)uVar8;
  (vframe->ShowTime).TimeLow = colorRan;
  uVar4 = mpp_frame_get_fmt(mframe);
  switch(uVar4 & 0xfffff) {
  case 0:
    vframe->ColorType = 5;
    vframe->OutputWidth = 0x20;
    break;
  case 1:
    vframe->ColorType = 5;
    vframe->ColorType = vframe->ColorType | 0x10000;
    vframe->OutputWidth = 0x22;
    break;
  case 2:
    vframe->ColorType = 7;
    vframe->OutputWidth = 0x10;
    break;
  case 3:
    vframe->ColorType = 7;
    vframe->ColorType = vframe->ColorType | 0x10000;
    vframe->OutputWidth = 0x23;
    break;
  default:
    break;
  case 0xf:
    vframe->ColorType = 8;
    vframe->OutputWidth = 0x11;
  }
  uVar4 = mpp_frame_get_fmt(mframe);
  if ((uVar4 & 0xf00000) == 0x100000) {
    vframe->ColorType = vframe->ColorType | 0x100000;
  }
  else if ((uVar4 & 0xf00000) == 0x200000) {
    vframe->ColorType = vframe->ColorType | 0x200000;
  }
  if (uVar3 == 0x10) {
    vframe->ColorType = vframe->ColorType | 0x1000000;
  }
  else if (uVar3 == 0x12) {
    vframe->ColorType = vframe->ColorType | 0x2000000;
  }
  if (pRVar7 != (RK_U32 *)0x0) {
    if (pRVar7[0x1c] == 0) {
      local_80 = (RK_U32 *)mpp_buffer_get_ptr_with_caller(pRVar7,"setup_VPU_FRAME_from_mpp_frame");
    }
    else {
      local_80 = (RK_U32 *)0x0;
    }
    RVar6 = mpp_buffer_get_fd_with_caller(pRVar7,"setup_VPU_FRAME_from_mpp_frame");
    vframe->FrameBusAddr[0] = RVar6;
    vframe->FrameBusAddr[1] = RVar6;
    (vframe->vpumem).vir_addr = local_80;
    (vframe->vpumem).phy_addr = RVar6;
    (vframe->vpumem).size = vframe->FrameWidth * vframe->FrameHeight * 3 >> 1;
    (vframe->vpumem).offset = pRVar7;
  }
  return;
}

Assistant:

static void setup_VPU_FRAME_from_mpp_frame(VpuCodecContext *ctx, VPU_FRAME *vframe, MppFrame mframe)
{
    MppBuffer buf = mpp_frame_get_buffer(mframe);
    RK_U64 pts  = mpp_frame_get_pts(mframe);
    RK_U32 mode = mpp_frame_get_mode(mframe);

    MppFrameColorRange colorRan = mpp_frame_get_color_range(mframe);
    MppFrameColorTransferCharacteristic colorTrc = mpp_frame_get_color_trc(mframe);
    MppFrameColorPrimaries colorPri = mpp_frame_get_color_primaries(mframe);
    MppFrameColorSpace colorSpa = mpp_frame_get_colorspace(mframe);

    if (buf)
        mpp_buffer_inc_ref(buf);

    vframe->CodingType = ctx->videoCoding;
    vframe->DisplayWidth = mpp_frame_get_width(mframe);
    vframe->DisplayHeight = mpp_frame_get_height(mframe);
    vframe->FrameWidth = mpp_frame_get_hor_stride(mframe);
    vframe->FrameHeight = mpp_frame_get_ver_stride(mframe);

    vframe->ColorRange = (colorRan == MPP_FRAME_RANGE_JPEG);
    vframe->ColorPrimaries = colorPri;
    vframe->ColorTransfer = colorTrc;
    vframe->ColorCoeffs = colorSpa;

    if (mode == MPP_FRAME_FLAG_FRAME)
        vframe->FrameType = 0;
    else {
        RK_U32 field_order = mode & MPP_FRAME_FLAG_FIELD_ORDER_MASK;
        if (field_order == MPP_FRAME_FLAG_TOP_FIRST)
            vframe->FrameType = 1;
        else if (field_order == MPP_FRAME_FLAG_BOT_FIRST)
            vframe->FrameType = 2;
        else if (field_order == MPP_FRAME_FLAG_DEINTERLACED)
            vframe->FrameType = 4;
    }
    vframe->ErrorInfo = mpp_frame_get_errinfo(mframe) | mpp_frame_get_discard(mframe);
    vframe->ShowTime.TimeHigh = (RK_U32)(pts >> 32);
    vframe->ShowTime.TimeLow = (RK_U32)pts;
    switch (mpp_frame_get_fmt(mframe) & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420SP: {
        vframe->ColorType = VPU_OUTPUT_FORMAT_YUV420_SEMIPLANAR;
        vframe->OutputWidth = 0x20;
    } break;
    case MPP_FMT_YUV420SP_10BIT: {
        vframe->ColorType = VPU_OUTPUT_FORMAT_YUV420_SEMIPLANAR;
        vframe->ColorType |= VPU_OUTPUT_FORMAT_BIT_10;
        vframe->OutputWidth = 0x22;
    } break;
    case MPP_FMT_YUV422SP: {
        vframe->ColorType = VPU_OUTPUT_FORMAT_YUV422;
        vframe->OutputWidth = 0x10;
    } break;
    case MPP_FMT_YUV422SP_10BIT: {
        vframe->ColorType = VPU_OUTPUT_FORMAT_YUV422;
        vframe->ColorType |= VPU_OUTPUT_FORMAT_BIT_10;
        vframe->OutputWidth = 0x23;
    } break;
    case MPP_FMT_YUV444SP: {
        vframe->ColorType = VPU_OUTPUT_FORMAT_YUV444;
        vframe->OutputWidth = 0x11;
    } break;
    default: {
    } break;
    }

    switch (mpp_frame_get_fmt(mframe) & MPP_FRAME_FBC_MASK) {
    case MPP_FRAME_FBC_AFBC_V1: {
        vframe->ColorType |= VPU_OUTPUT_FORMAT_FBC_AFBC_V1;
    } break;
    case MPP_FRAME_FBC_AFBC_V2: {
        vframe->ColorType |= VPU_OUTPUT_FORMAT_FBC_AFBC_V2;
    } break;
    default: {
    } break;
    }

    switch (colorTrc) {
    case MPP_FRAME_TRC_SMPTEST2084: {
        vframe->ColorType |= VPU_OUTPUT_FORMAT_DYNCRANGE_HDR10; //HDR10
    } break;
    case MPP_FRAME_TRC_ARIB_STD_B67: {
        vframe->ColorType |= VPU_OUTPUT_FORMAT_DYNCRANGE_HDR_HLG; //HDR_HLG
    } break;
    default: {
    } break;
    }

    if (buf) {
        MppBufferImpl *p = (MppBufferImpl*)buf;
        void *ptr = (p->mode == MPP_BUFFER_INTERNAL) ?
                    mpp_buffer_get_ptr(buf) : NULL;
        RK_S32 fd = mpp_buffer_get_fd(buf);

        vframe->FrameBusAddr[0] = fd;
        vframe->FrameBusAddr[1] = fd;
        vframe->vpumem.vir_addr = (RK_U32*)ptr;
        vframe->vpumem.phy_addr = fd;

        vframe->vpumem.size = vframe->FrameWidth * vframe->FrameHeight * 3 / 2;
        vframe->vpumem.offset = (RK_U32*)buf;
    }
}